

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedBrs.cpp
# Opt level: O0

void wasm::RemoveUnusedBrs::scan(RemoveUnusedBrs *self,Expression **currp)

{
  bool bVar1;
  BasicType local_24;
  If *local_20;
  If *iff;
  Expression **currp_local;
  RemoveUnusedBrs *self_local;
  
  iff = (If *)currp;
  currp_local = (Expression **)self;
  Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>::pushTask
            (&(self->
              super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
              ).super_PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
              .super_Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>,
             visitAny,currp);
  local_20 = Expression::dynCast<wasm::If>
                       (*(Expression **)
                         &(iff->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression)
  ;
  if (local_20 == (If *)0x0) {
    bVar1 = Expression::is<wasm::TryTable>
                      (*(Expression **)
                        &(iff->super_SpecificExpression<(wasm::Expression::Id)2>).super_Expression);
    if ((bVar1) ||
       (bVar1 = Expression::is<wasm::Try>
                          (*(Expression **)
                            &(iff->super_SpecificExpression<(wasm::Expression::Id)2>).
                             super_Expression), bVar1)) {
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::push_back
                ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)
                 (currp_local + 0x30),(value_type *)iff);
      Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>::pushTask
                ((Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_> *)
                 (currp_local + 0xb),popCatcher,(Expression **)iff);
    }
    PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>::scan
              ((RemoveUnusedBrs *)currp_local,(Expression **)iff);
  }
  else {
    local_24 = unreachable;
    bVar1 = wasm::Type::operator==(&local_20->condition->type,&local_24);
    if (!bVar1) {
      Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>::pushTask
                ((Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_> *)
                 (currp_local + 0xb),
                 Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>::
                 doVisitIf,(Expression **)iff);
      if (local_20->ifFalse != (Expression *)0x0) {
        Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>::pushTask
                  ((Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_> *)
                   (currp_local + 0xb),scan,&local_20->ifFalse);
        Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>::pushTask
                  ((Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_> *)
                   (currp_local + 0xb),saveIfTrue,(Expression **)iff);
      }
      Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>::pushTask
                ((Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_> *)
                 (currp_local + 0xb),scan,&local_20->ifTrue);
      Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>::pushTask
                ((Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_> *)
                 (currp_local + 0xb),clear,(Expression **)iff);
      Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>::pushTask
                ((Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_> *)
                 (currp_local + 0xb),scan,&local_20->condition);
    }
  }
  return;
}

Assistant:

static void scan(RemoveUnusedBrs* self, Expression** currp) {
    self->pushTask(visitAny, currp);

    if (auto* iff = (*currp)->dynCast<If>()) {
      if (iff->condition->type == Type::unreachable) {
        // avoid trying to optimize this, we never reach it anyhow
        return;
      }
      self->pushTask(doVisitIf, currp);
      if (iff->ifFalse) {
        // we need to join up if-else control flow, and clear after the
        // condition
        self->pushTask(scan, &iff->ifFalse);
        // safe the ifTrue flow, we'll join it later
        self->pushTask(saveIfTrue, currp);
      }
      self->pushTask(scan, &iff->ifTrue);
      self->pushTask(clear, currp); // clear all flow after the condition
      self->pushTask(scan, &iff->condition);
      return;
    }
    if ((*currp)->is<TryTable>() || (*currp)->is<Try>()) {
      // Push the try we are reaching, and add a task to pop it, after all the
      // tasks that Super::scan will push for its children.
      self->catchers.push_back(*currp);
      self->pushTask(popCatcher, currp);
    }

    Super::scan(self, currp);
  }